

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLSceneLoader.cpp
# Opt level: O0

bool __thiscall
COLLADASaxFWL::SceneLoader::end__value____common_float_or_param_type(SceneLoader *this)

{
  long in_RDI;
  String *in_stack_00000008;
  
  KinematicsBindJointAxis::getValue(*(KinematicsBindJointAxis **)(in_RDI + 0x68));
  KinematicsFloatOrParam::setParamValue((KinematicsFloatOrParam *)this,in_stack_00000008);
  std::__cxx11::string::clear();
  return true;
}

Assistant:

bool SceneLoader::end__value____common_float_or_param_type()
	{
		mCurrentBindJointAxis->getValue().setParamValue(mCurrentCharacterData);
		mCurrentCharacterData.clear();
		return true;
	}